

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O0

int __thiscall webrtc::EchoCancellationImpl::GetMetrics(EchoCancellationImpl *this,Metrics *metrics)

{
  int err_00;
  reference this_00;
  pointer this_01;
  void *handle;
  undefined1 auStack_78 [4];
  int err;
  AecMetrics my_metrics;
  CritScope local_28;
  CritScope cs;
  Metrics *metrics_local;
  EchoCancellationImpl *this_local;
  
  cs.cs_ = (CriticalSection *)metrics;
  rtc::CritScope::CritScope(&local_28,this->crit_capture_);
  if (cs.cs_ == (CriticalSection *)0x0) {
    this_local._4_4_ = kNullPointerError;
  }
  else if (((this->enabled_ & 1U) == 0) || ((this->metrics_enabled_ & 1U) == 0)) {
    this_local._4_4_ = kNotEnabledError;
  }
  else {
    my_metrics.erle.max = 0;
    my_metrics.erle.min = 0;
    my_metrics.aNlp.instant = 0;
    my_metrics.aNlp.average = 0;
    my_metrics.erl.max = 0;
    my_metrics.erl.min = 0;
    my_metrics.erle.instant = 0;
    my_metrics.erle.average = 0;
    my_metrics.rerl.max = 0;
    my_metrics.rerl.min = 0;
    my_metrics.erl.instant = 0;
    my_metrics.erl.average = 0;
    auStack_78 = (undefined1  [4])0x0;
    err = 0;
    my_metrics.rerl.instant = 0;
    my_metrics.rerl.average = 0;
    my_metrics.aNlp.max = 0;
    *(undefined8 *)&(cs.cs_)->recursion_count_ = 0;
    cs.cs_[1].mutex_.__align = 0;
    ((cs.cs_)->mutex_).__data.__list.__next = (__pthread_internal_list *)0x0;
    (cs.cs_)->thread_ = 0;
    *(undefined8 *)((long)&(cs.cs_)->mutex_ + 0x10) = 0;
    ((cs.cs_)->mutex_).__data.__list.__prev = (__pthread_internal_list *)0x0;
    ((cs.cs_)->mutex_).__align = 0;
    *(undefined8 *)((long)&(cs.cs_)->mutex_ + 8) = 0;
    cs.cs_[1].mutex_.__data.__owner = 0;
    this_00 = std::
              vector<std::unique_ptr<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>_>_>
              ::operator[](&this->cancellers_,0);
    this_01 = std::
              unique_ptr<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>
              ::operator->(this_00);
    handle = Canceller::state(this_01);
    err_00 = WebRtcAec_GetMetrics(handle,(AecMetrics *)auStack_78);
    if (err_00 == 0) {
      ((cs.cs_)->mutex_).__data.__lock = (int)auStack_78;
      ((cs.cs_)->mutex_).__data.__count = err;
      ((cs.cs_)->mutex_).__data.__owner = my_metrics.rerl.instant;
      ((cs.cs_)->mutex_).__data.__nusers = my_metrics.rerl.average;
      ((cs.cs_)->mutex_).__data.__kind = my_metrics.rerl.max;
      *(int *)((long)&(cs.cs_)->mutex_ + 0x14) = my_metrics.rerl.min;
      *(int *)((long)&(cs.cs_)->mutex_ + 0x18) = my_metrics.erl.instant;
      *(int *)((long)&(cs.cs_)->mutex_ + 0x1c) = my_metrics.erl.average;
      *(int *)((long)&(cs.cs_)->mutex_ + 0x20) = my_metrics.erl.max;
      *(int *)((long)&(cs.cs_)->mutex_ + 0x24) = my_metrics.erl.min;
      *(int *)&(cs.cs_)->thread_ = my_metrics.erle.instant;
      *(int *)((long)&(cs.cs_)->thread_ + 4) = my_metrics.erle.average;
      (cs.cs_)->recursion_count_ = my_metrics.erle.max;
      *(int *)&(cs.cs_)->field_0x34 = my_metrics.erle.min;
      cs.cs_[1].mutex_.__data.__lock = my_metrics.aNlp.instant;
      cs.cs_[1].mutex_.__data.__count = my_metrics.aNlp.average;
      cs.cs_[1].mutex_.__data.__owner = my_metrics.aNlp.max;
      this_local._4_4_ = kNoError;
    }
    else {
      this_local._4_4_ = anon_unknown_0::MapError(err_00);
    }
  }
  rtc::CritScope::~CritScope(&local_28);
  return this_local._4_4_;
}

Assistant:

int EchoCancellationImpl::GetMetrics(Metrics* metrics) {
  rtc::CritScope cs(crit_capture_);
  if (metrics == NULL) {
    return AudioProcessing::kNullPointerError;
  }

  if (!enabled_ || !metrics_enabled_) {
    return AudioProcessing::kNotEnabledError;
  }

  AecMetrics my_metrics;
  memset(&my_metrics, 0, sizeof(my_metrics));
  memset(metrics, 0, sizeof(Metrics));

  const int err = WebRtcAec_GetMetrics(cancellers_[0]->state(), &my_metrics);
  if (err != AudioProcessing::kNoError) {
    return MapError(err);
  }

  metrics->residual_echo_return_loss.instant = my_metrics.rerl.instant;
  metrics->residual_echo_return_loss.average = my_metrics.rerl.average;
  metrics->residual_echo_return_loss.maximum = my_metrics.rerl.max;
  metrics->residual_echo_return_loss.minimum = my_metrics.rerl.min;

  metrics->echo_return_loss.instant = my_metrics.erl.instant;
  metrics->echo_return_loss.average = my_metrics.erl.average;
  metrics->echo_return_loss.maximum = my_metrics.erl.max;
  metrics->echo_return_loss.minimum = my_metrics.erl.min;

  metrics->echo_return_loss_enhancement.instant = my_metrics.erle.instant;
  metrics->echo_return_loss_enhancement.average = my_metrics.erle.average;
  metrics->echo_return_loss_enhancement.maximum = my_metrics.erle.max;
  metrics->echo_return_loss_enhancement.minimum = my_metrics.erle.min;

  metrics->a_nlp.instant = my_metrics.aNlp.instant;
  metrics->a_nlp.average = my_metrics.aNlp.average;
  metrics->a_nlp.maximum = my_metrics.aNlp.max;
  metrics->a_nlp.minimum = my_metrics.aNlp.min;

  metrics->divergent_filter_fraction = my_metrics.divergent_filter_fraction;
  return AudioProcessing::kNoError;
}